

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

uint256 * anon_unknown.dwarf_23aa348::GetSpentScriptsSHA256
                    (uint256 *__return_storage_ptr__,
                    vector<CTxOut,_std::allocator<CTxOut>_> *outputs_spent)

{
  pointer pCVar1;
  CTxOut *txout;
  pointer pCVar2;
  long in_FS_OFFSET;
  HashWriter ss;
  CSHA256 local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.buf[0x30] = '\0';
  local_98.buf[0x31] = '\0';
  local_98.buf[0x32] = '\0';
  local_98.buf[0x33] = '\0';
  local_98.buf[0x34] = '\0';
  local_98.buf[0x35] = '\0';
  local_98.buf[0x36] = '\0';
  local_98.buf[0x37] = '\0';
  local_98.buf[0x38] = '\0';
  local_98.buf[0x39] = '\0';
  local_98.buf[0x3a] = '\0';
  local_98.buf[0x3b] = '\0';
  local_98.buf[0x3c] = '\0';
  local_98.buf[0x3d] = '\0';
  local_98.buf[0x3e] = '\0';
  local_98.buf[0x3f] = '\0';
  local_98.buf[0x20] = '\0';
  local_98.buf[0x21] = '\0';
  local_98.buf[0x22] = '\0';
  local_98.buf[0x23] = '\0';
  local_98.buf[0x24] = '\0';
  local_98.buf[0x25] = '\0';
  local_98.buf[0x26] = '\0';
  local_98.buf[0x27] = '\0';
  local_98.buf[0x28] = '\0';
  local_98.buf[0x29] = '\0';
  local_98.buf[0x2a] = '\0';
  local_98.buf[0x2b] = '\0';
  local_98.buf[0x2c] = '\0';
  local_98.buf[0x2d] = '\0';
  local_98.buf[0x2e] = '\0';
  local_98.buf[0x2f] = '\0';
  local_98.buf[0x10] = '\0';
  local_98.buf[0x11] = '\0';
  local_98.buf[0x12] = '\0';
  local_98.buf[0x13] = '\0';
  local_98.buf[0x14] = '\0';
  local_98.buf[0x15] = '\0';
  local_98.buf[0x16] = '\0';
  local_98.buf[0x17] = '\0';
  local_98.buf[0x18] = '\0';
  local_98.buf[0x19] = '\0';
  local_98.buf[0x1a] = '\0';
  local_98.buf[0x1b] = '\0';
  local_98.buf[0x1c] = '\0';
  local_98.buf[0x1d] = '\0';
  local_98.buf[0x1e] = '\0';
  local_98.buf[0x1f] = '\0';
  local_98.buf[0] = '\0';
  local_98.buf[1] = '\0';
  local_98.buf[2] = '\0';
  local_98.buf[3] = '\0';
  local_98.buf[4] = '\0';
  local_98.buf[5] = '\0';
  local_98.buf[6] = '\0';
  local_98.buf[7] = '\0';
  local_98.buf[8] = '\0';
  local_98.buf[9] = '\0';
  local_98.buf[10] = '\0';
  local_98.buf[0xb] = '\0';
  local_98.buf[0xc] = '\0';
  local_98.buf[0xd] = '\0';
  local_98.buf[0xe] = '\0';
  local_98.buf[0xf] = '\0';
  local_98.s[4] = 0;
  local_98.s[5] = 0;
  local_98.s[6] = 0;
  local_98.s[7] = 0;
  local_98.s[0] = 0;
  local_98.s[1] = 0;
  local_98.s[2] = 0;
  local_98.s[3] = 0;
  local_98.bytes = 0;
  CSHA256::CSHA256(&local_98);
  pCVar1 = (outputs_spent->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar2 = (outputs_spent->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    Serialize<HashWriter,28u,unsigned_char>
              ((HashWriter *)&local_98,&(pCVar2->scriptPubKey).super_CScriptBase);
  }
  HashWriter::GetSHA256(__return_storage_ptr__,(HashWriter *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetSpentScriptsSHA256(const std::vector<CTxOut>& outputs_spent)
{
    HashWriter ss{};
    for (const auto& txout : outputs_spent) {
        ss << txout.scriptPubKey;
    }
    return ss.GetSHA256();
}